

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O0

void __thiscall
olc::Renderer_OGL10::DrawLayerQuad(Renderer_OGL10 *this,vf2d *offset,vf2d *scale,Pixel tint)

{
  vf2d *scale_local;
  vf2d *offset_local;
  Renderer_OGL10 *this_local;
  Pixel tint_local;
  
  glBegin(7);
  this_local._4_1_ = tint.field_0._0_1_;
  this_local._5_1_ = tint.field_0._1_1_;
  this_local._6_1_ = tint.field_0._2_1_;
  this_local._7_1_ = tint.field_0._3_1_;
  glColor4ub(this_local._4_1_,this_local._5_1_,this_local._6_1_,this_local._7_1_);
  glTexCoord2f(scale->x * 0.0 + offset->x,scale->y + offset->y);
  glVertex3f(0xbf800000,0xbf800000,0);
  glTexCoord2f(scale->x * 0.0 + offset->x,scale->y * 0.0 + offset->y);
  glVertex3f(0xbf800000,0x3f800000,0);
  glTexCoord2f(scale->x + offset->x,scale->y * 0.0 + offset->y);
  glVertex3f(0x3f800000,0x3f800000,0);
  glTexCoord2f(scale->x + offset->x,scale->y + offset->y);
  glVertex3f(0x3f800000,0xbf800000,0);
  glEnd();
  return;
}

Assistant:

void DrawLayerQuad(const olc::vf2d& offset, const olc::vf2d& scale, const olc::Pixel tint) override
		{
			glBegin(GL_QUADS);
			glColor4ub(tint.r, tint.g, tint.b, tint.a);
			glTexCoord2f(0.0f * scale.x + offset.x, 1.0f * scale.y + offset.y);
			glVertex3f(-1.0f /*+ vSubPixelOffset.x*/, -1.0f /*+ vSubPixelOffset.y*/, 0.0f);
			glTexCoord2f(0.0f * scale.x + offset.x, 0.0f * scale.y + offset.y);
			glVertex3f(-1.0f /*+ vSubPixelOffset.x*/, 1.0f /*+ vSubPixelOffset.y*/, 0.0f);
			glTexCoord2f(1.0f * scale.x + offset.x, 0.0f * scale.y + offset.y);
			glVertex3f(1.0f /*+ vSubPixelOffset.x*/, 1.0f /*+ vSubPixelOffset.y*/, 0.0f);
			glTexCoord2f(1.0f * scale.x + offset.x, 1.0f * scale.y + offset.y);
			glVertex3f(1.0f /*+ vSubPixelOffset.x*/, -1.0f /*+ vSubPixelOffset.y*/, 0.0f);
			glEnd();
		}